

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void ChooseContextMap(int quality,uint32_t *bigram_histo,size_t *num_literal_contexts,
                     uint32_t **literal_context_map)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  double entropy [4];
  size_t dummy;
  size_t i;
  size_t total;
  uint32_t two_prefix_histo [6];
  uint local_1d4 [2];
  uint32_t monogram_histo [3];
  uint32_t **literal_context_map_local;
  size_t *num_literal_contexts_local;
  uint32_t *bigram_histo_local;
  int quality_local;
  size_t p_3;
  uint32_t *population_end_3;
  double retval_3;
  size_t sum_3;
  uint *local_178;
  size_t p_2;
  uint32_t *population_end_2;
  double retval_2;
  size_t sum_2;
  uint *local_140;
  size_t p_1;
  uint32_t *population_end_1;
  double retval_1;
  size_t sum_1;
  size_t *local_108;
  size_t p;
  uint32_t *population_end;
  double retval;
  size_t sum;
  uint *local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  double local_20;
  double local_10;
  undefined4 uVar33;
  
  monogram_histo._4_8_ = literal_context_map;
  memset(local_1d4,0,0xc);
  memset(&total,0,0x18);
  for (dummy = 0; dummy < 9; dummy = dummy + 1) {
    local_1d4[dummy % 3] = bigram_histo[dummy] + local_1d4[dummy % 3];
    two_prefix_histo[dummy % 6 - 2] = bigram_histo[dummy] + two_prefix_histo[dummy % 6 - 2];
  }
  local_d0 = local_1d4;
  retval = 0.0;
  population_end = (uint32_t *)0x0;
  while( true ) {
    puVar4 = local_d0 + 1;
    uVar1 = *local_d0;
    uVar2 = CONCAT44(0,uVar1);
    uVar3 = (long)retval + uVar2;
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar2;
    auVar11._12_4_ = 0x45300000;
    if (uVar2 < 0x100) {
      local_c0 = kLog2Table[uVar2];
    }
    else {
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar2;
      auVar12._12_4_ = 0x45300000;
      local_c0 = log2((auVar12._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
    }
    population_end =
         (uint32_t *)
         (-((auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_c0 +
         (double)population_end);
    if (monogram_histo + 1 <= puVar4) break;
    local_d0 = local_d0 + 2;
    uVar1 = *puVar4;
    uVar2 = CONCAT44(0,uVar1);
    retval = (double)(uVar3 + uVar2);
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar2;
    auVar9._12_4_ = 0x45300000;
    if (uVar2 < 0x100) {
      local_b0 = kLog2Table[uVar2];
    }
    else {
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar2;
      auVar10._12_4_ = 0x45300000;
      local_b0 = log2((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
    }
    population_end =
         (uint32_t *)
         (-((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_b0 +
         (double)population_end);
  }
  if (uVar3 != 0) {
    uVar33 = (undefined4)(uVar3 >> 0x20);
    auVar13._8_4_ = uVar33;
    auVar13._0_8_ = uVar3;
    auVar13._12_4_ = 0x45300000;
    if (uVar3 < 0x100) {
      local_a0 = kLog2Table[uVar3];
    }
    else {
      auVar14._8_4_ = uVar33;
      auVar14._0_8_ = uVar3;
      auVar14._12_4_ = 0x45300000;
      local_a0 = log2((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    }
    population_end =
         (uint32_t *)
         (((auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * local_a0 +
         (double)population_end);
  }
  local_108 = &total;
  retval_1 = 0.0;
  population_end_1 = (uint32_t *)0x0;
  while( true ) {
    puVar4 = (uint *)((long)local_108 + 4);
    uVar1 = (uint)*local_108;
    uVar2 = CONCAT44(0,uVar1);
    uVar3 = (long)retval_1 + uVar2;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar2;
    auVar17._12_4_ = 0x45300000;
    if (uVar2 < 0x100) {
      local_90 = kLog2Table[uVar2];
    }
    else {
      auVar18._8_4_ = 0;
      auVar18._0_8_ = uVar2;
      auVar18._12_4_ = 0x45300000;
      local_90 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
    }
    population_end_1 =
         (uint32_t *)
         (-((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_90 +
         (double)population_end_1);
    if (two_prefix_histo + 1 <= puVar4) break;
    local_108 = local_108 + 1;
    uVar1 = *puVar4;
    uVar2 = CONCAT44(0,uVar1);
    retval_1 = (double)(uVar3 + uVar2);
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0x45300000;
    if (uVar2 < 0x100) {
      local_80 = kLog2Table[uVar2];
    }
    else {
      auVar16._8_4_ = 0;
      auVar16._0_8_ = uVar2;
      auVar16._12_4_ = 0x45300000;
      local_80 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
    }
    population_end_1 =
         (uint32_t *)
         (-((auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_80 +
         (double)population_end_1);
  }
  if (uVar3 != 0) {
    uVar33 = (undefined4)(uVar3 >> 0x20);
    auVar19._8_4_ = uVar33;
    auVar19._0_8_ = uVar3;
    auVar19._12_4_ = 0x45300000;
    if (uVar3 < 0x100) {
      local_70 = kLog2Table[uVar3];
    }
    else {
      auVar20._8_4_ = uVar33;
      auVar20._0_8_ = uVar3;
      auVar20._12_4_ = 0x45300000;
      local_70 = log2((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    }
    population_end_1 =
         (uint32_t *)
         (((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * local_70 +
         (double)population_end_1);
  }
  local_140 = two_prefix_histo + 1;
  retval_2 = 0.0;
  population_end_2 = (uint32_t *)0x0;
  while( true ) {
    puVar4 = local_140 + 1;
    uVar1 = *local_140;
    uVar2 = CONCAT44(0,uVar1);
    uVar3 = (long)retval_2 + uVar2;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = uVar2;
    auVar23._12_4_ = 0x45300000;
    if (uVar2 < 0x100) {
      local_60 = kLog2Table[uVar2];
    }
    else {
      auVar24._8_4_ = 0;
      auVar24._0_8_ = uVar2;
      auVar24._12_4_ = 0x45300000;
      local_60 = log2((auVar24._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
    }
    population_end_2 =
         (uint32_t *)
         (-((auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_60 +
         (double)population_end_2);
    if (two_prefix_histo + 4 <= puVar4) break;
    local_140 = local_140 + 2;
    uVar1 = *puVar4;
    uVar2 = CONCAT44(0,uVar1);
    retval_2 = (double)(uVar3 + uVar2);
    auVar21._8_4_ = 0;
    auVar21._0_8_ = uVar2;
    auVar21._12_4_ = 0x45300000;
    if (uVar2 < 0x100) {
      local_50 = kLog2Table[uVar2];
    }
    else {
      auVar22._8_4_ = 0;
      auVar22._0_8_ = uVar2;
      auVar22._12_4_ = 0x45300000;
      local_50 = log2((auVar22._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
    }
    population_end_2 =
         (uint32_t *)
         (-((auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_50 +
         (double)population_end_2);
  }
  if (uVar3 != 0) {
    uVar33 = (undefined4)(uVar3 >> 0x20);
    auVar25._8_4_ = uVar33;
    auVar25._0_8_ = uVar3;
    auVar25._12_4_ = 0x45300000;
    if (uVar3 < 0x100) {
      local_40 = kLog2Table[uVar3];
    }
    else {
      auVar26._8_4_ = uVar33;
      auVar26._0_8_ = uVar3;
      auVar26._12_4_ = 0x45300000;
      local_40 = log2((auVar26._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    }
    population_end_2 =
         (uint32_t *)
         (((auVar25._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * local_40 +
         (double)population_end_2);
  }
  entropy[2] = 0.0;
  for (dummy = 0; dummy < 3; dummy = dummy + 1) {
    local_178 = bigram_histo + dummy * 3;
    retval_3 = 0.0;
    population_end_3 = (uint32_t *)0x0;
    puVar4 = local_178 + 3;
    while( true ) {
      puVar5 = local_178 + 1;
      uVar1 = *local_178;
      uVar2 = CONCAT44(0,uVar1);
      uVar3 = (long)retval_3 + uVar2;
      auVar29._8_4_ = 0;
      auVar29._0_8_ = uVar2;
      auVar29._12_4_ = 0x45300000;
      if (uVar2 < 0x100) {
        local_30 = kLog2Table[uVar2];
      }
      else {
        auVar30._8_4_ = 0;
        auVar30._0_8_ = uVar2;
        auVar30._12_4_ = 0x45300000;
        local_30 = log2((auVar30._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
      }
      population_end_3 =
           (uint32_t *)
           (-((auVar29._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_30 +
           (double)population_end_3);
      if (puVar4 <= puVar5) break;
      local_178 = local_178 + 2;
      uVar1 = *puVar5;
      uVar2 = CONCAT44(0,uVar1);
      retval_3 = (double)(uVar3 + uVar2);
      auVar27._8_4_ = 0;
      auVar27._0_8_ = uVar2;
      auVar27._12_4_ = 0x45300000;
      if (uVar2 < 0x100) {
        local_20 = kLog2Table[uVar2];
      }
      else {
        auVar28._8_4_ = 0;
        auVar28._0_8_ = uVar2;
        auVar28._12_4_ = 0x45300000;
        local_20 = log2((auVar28._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
      }
      population_end_3 =
           (uint32_t *)
           (-((auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_20 +
           (double)population_end_3);
    }
    if (uVar3 != 0) {
      uVar33 = (undefined4)(uVar3 >> 0x20);
      auVar31._8_4_ = uVar33;
      auVar31._0_8_ = uVar3;
      auVar31._12_4_ = 0x45300000;
      if (uVar3 < 0x100) {
        local_10 = kLog2Table[uVar3];
      }
      else {
        auVar32._8_4_ = uVar33;
        auVar32._0_8_ = uVar3;
        auVar32._12_4_ = 0x45300000;
        local_10 = log2((auVar32._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
      }
      population_end_3 =
           (uint32_t *)
           (((auVar31._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * local_10 +
           (double)population_end_3);
    }
    entropy[2] = (double)population_end_3 + entropy[2];
  }
  uVar1 = local_1d4[0] + local_1d4[1] + monogram_histo[0];
  auVar34._4_8_ = 0;
  auVar34._0_4_ = uVar1;
  auVar34._12_4_ = 0x45300000;
  dVar6 = 1.0 / ((auVar34._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
  dVar7 = dVar6 * (double)population_end;
  dVar8 = dVar6 * ((double)population_end_1 + (double)population_end_2);
  entropy[2] = dVar6 * entropy[2];
  if (quality < 7) {
    entropy[2] = dVar7 * 10.0;
  }
  if ((0.2 <= dVar7 - dVar8) || (0.2 <= dVar7 - entropy[2])) {
    if (0.02 <= dVar8 - entropy[2]) {
      *num_literal_contexts = 3;
      *(uint32_t **)monogram_histo._4_8_ = ChooseContextMap::kStaticContextMapContinuation;
    }
    else {
      *num_literal_contexts = 2;
      *(uint32_t **)monogram_histo._4_8_ = ChooseContextMap::kStaticContextMapSimpleUTF8;
    }
  }
  else {
    *num_literal_contexts = 1;
  }
  return;
}

Assistant:

static void ChooseContextMap(int quality,
                             uint32_t* bigram_histo,
                             size_t* num_literal_contexts,
                             const uint32_t** literal_context_map) {
  static const uint32_t kStaticContextMapContinuation[64] = {
    1, 1, 2, 2, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
  };
  static const uint32_t kStaticContextMapSimpleUTF8[64] = {
    0, 0, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
  };

  uint32_t monogram_histo[3] = { 0 };
  uint32_t two_prefix_histo[6] = { 0 };
  size_t total;
  size_t i;
  size_t dummy;
  double entropy[4];
  for (i = 0; i < 9; ++i) {
    monogram_histo[i % 3] += bigram_histo[i];
    two_prefix_histo[i % 6] += bigram_histo[i];
  }
  entropy[1] = ShannonEntropy(monogram_histo, 3, &dummy);
  entropy[2] = (ShannonEntropy(two_prefix_histo, 3, &dummy) +
                ShannonEntropy(two_prefix_histo + 3, 3, &dummy));
  entropy[3] = 0;
  for (i = 0; i < 3; ++i) {
    entropy[3] += ShannonEntropy(bigram_histo + 3 * i, 3, &dummy);
  }

  total = monogram_histo[0] + monogram_histo[1] + monogram_histo[2];
  BROTLI_DCHECK(total != 0);
  entropy[0] = 1.0 / (double)total;
  entropy[1] *= entropy[0];
  entropy[2] *= entropy[0];
  entropy[3] *= entropy[0];

  if (quality < MIN_QUALITY_FOR_HQ_CONTEXT_MODELING) {
    /* 3 context models is a bit slower, don't use it at lower qualities. */
    entropy[3] = entropy[1] * 10;
  }
  /* If expected savings by symbol are less than 0.2 bits, skip the
     context modeling -- in exchange for faster decoding speed. */
  if (entropy[1] - entropy[2] < 0.2 &&
      entropy[1] - entropy[3] < 0.2) {
    *num_literal_contexts = 1;
  } else if (entropy[2] - entropy[3] < 0.02) {
    *num_literal_contexts = 2;
    *literal_context_map = kStaticContextMapSimpleUTF8;
  } else {
    *num_literal_contexts = 3;
    *literal_context_map = kStaticContextMapContinuation;
  }
}